

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Analysis.cpp
# Opt level: O1

void PropagateExternalIncludes
               (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>_>_>
                *files)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  _Hash_node_base **pp_Var4;
  bool bVar5;
  bool bVar6;
  _Hash_node_base *p_Var7;
  _Hash_node_base *p_Var8;
  
  p_Var1 = (files->_M_h)._M_before_begin._M_nxt;
  if (p_Var1 != (_Hash_node_base *)0x0) {
    p_Var7 = p_Var1;
    bVar5 = false;
    do {
      bVar6 = bVar5;
      if ((*(char *)&p_Var7[0x20]._M_nxt == '\x01') &&
         (p_Var2 = p_Var7[0x1d]._M_nxt, p_Var2 != (_Hash_node_base *)0x0)) {
        for (p_Var8 = p_Var7[0x11]._M_nxt; p_Var8 != (_Hash_node_base *)0x0; p_Var8 = p_Var8->_M_nxt
            ) {
          p_Var3 = p_Var8[1]._M_nxt;
          if ((*(char *)&p_Var3[0x1b]._M_nxt == '\0') && (p_Var3[0x18]._M_nxt == p_Var2)) {
            *(undefined1 *)&p_Var3[0x1b]._M_nxt = 1;
            bVar6 = true;
          }
        }
      }
      pp_Var4 = &p_Var7->_M_nxt;
      p_Var7 = *pp_Var4;
      bVar5 = bVar6;
    } while ((*pp_Var4 != (_Hash_node_base *)0x0) ||
            ((p_Var1 != (_Hash_node_base *)0x0 && (p_Var7 = p_Var1, bVar5 = false, bVar6))));
  }
  return;
}

Assistant:

void PropagateExternalIncludes(std::unordered_map<std::string, File>& files) {
    bool foundChange;
    do {
        foundChange = false;
        for (auto &fp : files) {
            if (fp.second.hasExternalInclude && fp.second.component) {
                for (auto &dep : fp.second.dependencies) {
                    if (!dep->hasExternalInclude && dep->component == fp.second.component) {
                        dep->hasExternalInclude = true;
                        foundChange = true;
                    }
                }
            }
        }
    } while (foundChange);
}